

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvAdvDiff_bnd.c
# Opt level: O0

int check_retval(int retval,char *funcname)

{
  undefined8 in_RSI;
  uint in_EDI;
  uint local_4;
  
  if ((int)in_EDI < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",in_RSI,(ulong)in_EDI);
  }
  local_4 = (uint)((int)in_EDI < 0);
  return local_4;
}

Assistant:

static int check_retval(int retval, const char* funcname)
{
  /* Check if retval < 0 */
  if (retval < 0)
  {
    fprintf(stderr, "\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
            funcname, retval);
    return (1);
  }
  else { return (0); }
}